

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

bool __thiscall FakeCommandRunner::StartCommand(FakeCommandRunner *this,Edge *edge)

{
  pointer *pppEVar1;
  int *piVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  iterator __position;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> __last;
  VirtualFileSystem *pVVar5;
  Node *pNVar6;
  long lVar7;
  Edge *pEVar8;
  int iVar9;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var10;
  ulong uVar11;
  long *plVar12;
  size_type *psVar13;
  pointer ppNVar14;
  char *__end;
  string depfile;
  string dep;
  string contents;
  Edge *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar3 = (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar4 = (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_f8 = edge;
  if (this->max_active_edges_ <= (ulong)((long)ppEVar4 - (long)ppEVar3 >> 3)) {
    __assert_fail("active_edges_.size() < max_active_edges_",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24c,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  _Var10 = std::
           __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                     (ppEVar3,ppEVar4,&local_f8);
  if (_Var10._M_current !=
      (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("find(active_edges_.begin(), active_edges_.end(), edge) == active_edges_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24e,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  Edge::EvaluateCommand_abi_cxx11_(&local_d0,local_f8,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->commands_ran_,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_);
  if (((((iVar9 == 0) ||
        (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)) ||
       (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)) ||
      (((iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0 ||
        (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)) ||
       ((iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0 ||
        ((iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0 ||
         (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)))))))) ||
     (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)) {
    ppNVar14 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar14 !=
        (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pVVar5 = this->fs_;
        pNVar6 = *ppNVar14;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"","");
        VirtualFileSystem::Create(pVVar5,&pNVar6->path_,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
        }
        ppNVar14 = ppNVar14 + 1;
      } while (ppNVar14 !=
               (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    goto LAB_0012901b;
  }
  iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_);
  if ((((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)
       ) || (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0)) ||
     (iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar9 == 0))
  goto LAB_0012901b;
  iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_);
  if (iVar9 == 0) {
    if ((local_f8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_f8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!edge->inputs_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                    ,0x263,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
    }
    if ((long)(local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != 8) {
      __assert_fail("edge->outputs_.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                    ,0x264,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    iVar9 = (*(this->fs_->super_DiskInterface).super_FileReader._vptr_FileReader[2])
                      (this->fs_,
                       *(local_f8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,&local_d0,&local_f0);
    if (iVar9 == 0) {
      (*(this->fs_->super_DiskInterface).super_FileReader._vptr_FileReader[5])
                (this->fs_,
                 *(local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,&local_d0);
    }
LAB_0012957e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_00129588:
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_);
    pEVar8 = local_f8;
    if (iVar9 != 0) {
      iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_);
      pEVar8 = local_f8;
      if (iVar9 != 0) {
        iVar9 = std::__cxx11::string::compare((char *)local_f8->rule_);
        pEVar8 = local_f8;
        if (iVar9 != 0) {
          puts("unknown command");
          return false;
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_dependency","");
        Edge::GetBinding(&local_d0,pEVar8,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        Edge::GetUnescapedDepfile_abi_cxx11_(&local_f0,local_f8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        ppNVar14 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppNVar14 !=
            (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::operator+(&local_70,&(*ppNVar14)->path_,": ");
            std::operator+(&local_50,&local_70,&local_d0);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            psVar13 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_b0.field_2._M_allocated_capacity = *psVar13;
              local_b0.field_2._8_8_ = plVar12[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar13;
              local_b0._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_b0._M_string_length = plVar12[1];
            *plVar12 = (long)psVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            pVVar5 = this->fs_;
            pNVar6 = *ppNVar14;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
            VirtualFileSystem::Create(pVVar5,&pNVar6->path_,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            ppNVar14 = ppNVar14 + 1;
          } while (ppNVar14 !=
                   (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        VirtualFileSystem::Create(this->fs_,&local_f0,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0012957e;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_dependency","");
      Edge::GetBinding(&local_d0,pEVar8,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      ppNVar14 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppNVar14 !=
          (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pVVar5 = this->fs_;
          pNVar6 = *ppNVar14;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
          VirtualFileSystem::Create(pVVar5,&pNVar6->path_,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
          ppNVar14 = ppNVar14 + 1;
        } while (ppNVar14 !=
                 (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      pVVar5 = this->fs_;
      piVar2 = &pVVar5->now_;
      *piVar2 = *piVar2 + 1;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      VirtualFileSystem::Create(pVVar5,&local_d0,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_00129595;
      goto LAB_00129588;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_dependency","");
    Edge::GetBinding(&local_d0,pEVar8,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    pVVar5 = this->fs_;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    VirtualFileSystem::Create(pVVar5,&local_d0,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    piVar2 = &this->fs_->now_;
    *piVar2 = *piVar2 + 1;
    ppNVar14 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar14 !=
        (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pVVar5 = this->fs_;
        pNVar6 = *ppNVar14;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
        VirtualFileSystem::Create(pVVar5,&pNVar6->path_,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        ppNVar14 = ppNVar14 + 1;
      } while (ppNVar14 !=
               (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
LAB_00129595:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
LAB_0012901b:
  __position._M_current =
       (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
              ((vector<Edge*,std::allocator<Edge*>> *)&this->active_edges_,__position,&local_f8);
  }
  else {
    *__position._M_current = local_f8;
    pppEVar1 = &(this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  _Var10._M_current =
       (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var10._M_current != __last._M_current) {
    uVar11 = (long)__last._M_current - (long)_Var10._M_current >> 3;
    lVar7 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
              (_Var10,__last,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x148238);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
              (_Var10,__last,(_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x148238);
  }
  return true;
}

Assistant:

bool FakeCommandRunner::StartCommand(Edge* edge) {
  assert(active_edges_.size() < max_active_edges_);
  assert(find(active_edges_.begin(), active_edges_.end(), edge)
         == active_edges_.end());
  commands_ran_.push_back(edge->EvaluateCommand());
  if (edge->rule().name() == "cat"  ||
      edge->rule().name() == "cat_rsp" ||
      edge->rule().name() == "cat_rsp_out" ||
      edge->rule().name() == "cc" ||
      edge->rule().name() == "cp_multi_msvc" ||
      edge->rule().name() == "cp_multi_gcc" ||
      edge->rule().name() == "touch" ||
      edge->rule().name() == "touch-interrupt" ||
      edge->rule().name() == "touch-fail-tick2") {
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "true" ||
             edge->rule().name() == "fail" ||
             edge->rule().name() == "interrupt" ||
             edge->rule().name() == "console") {
    // Don't do anything.
  } else if (edge->rule().name() == "cp") {
    assert(!edge->inputs_.empty());
    assert(edge->outputs_.size() == 1);
    string content;
    string err;
    if (fs_->ReadFile(edge->inputs_[0]->path(), &content, &err) ==
        DiskInterface::Okay)
      fs_->WriteFile(edge->outputs_[0]->path(), content);
  } else if (edge->rule().name() == "touch-implicit-dep-out") {
    string dep = edge->GetBinding("test_dependency");
    fs_->Create(dep, "");
    fs_->Tick();
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "touch-out-implicit-dep") {
    string dep = edge->GetBinding("test_dependency");
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
    fs_->Tick();
    fs_->Create(dep, "");
  } else if (edge->rule().name() == "generate-depfile") {
    string dep = edge->GetBinding("test_dependency");
    string depfile = edge->GetUnescapedDepfile();
    string contents;
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      contents += (*out)->path() + ": " + dep + "\n";
      fs_->Create((*out)->path(), "");
    }
    fs_->Create(depfile, contents);
  } else {
    printf("unknown command\n");
    return false;
  }

  active_edges_.push_back(edge);

  // Allow tests to control the order by the name of the first output.
  sort(active_edges_.begin(), active_edges_.end(),
       CompareEdgesByOutput::cmp);

  return true;
}